

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# xsurveyor.c
# Opt level: O3

int nn_xsurveyor_create(void *hint,nn_sockbase **sockbase)

{
  int extraout_EAX;
  nn_sockbase *self;
  nn_sockbase *self_00;
  
  self_00 = (nn_sockbase *)0x1b0;
  self = (nn_sockbase *)nn_alloc_(0x1b0);
  if (self != (nn_sockbase *)0x0) {
    nn_sockbase_init(self,&nn_xsurveyor_sockbase_vfptr,hint);
    nn_dist_init((nn_dist *)(self + 1));
    nn_fq_init((nn_fq *)&self[2].sock);
    *sockbase = self;
    return 0;
  }
  nn_xsurveyor_create_cold_1();
  nn_fq_term((nn_fq *)&self_00[2].sock);
  nn_dist_term((nn_dist *)(self_00 + 1));
  nn_sockbase_term(self_00);
  nn_free(self_00);
  return extraout_EAX;
}

Assistant:

static int nn_xsurveyor_create (void *hint, struct nn_sockbase **sockbase)
{
    struct nn_xsurveyor *self;

    self = nn_alloc (sizeof (struct nn_xsurveyor), "socket (xsurveyor)");
    alloc_assert (self);
    nn_xsurveyor_init (self, &nn_xsurveyor_sockbase_vfptr, hint);
    *sockbase = &self->sockbase;

    return 0;
}